

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

lua_Integer luaL_len(lua_State *L,int idx)

{
  int local_24;
  lua_Integer lStack_20;
  int isnum;
  lua_Integer l;
  lua_State *plStack_10;
  int idx_local;
  lua_State *L_local;
  
  l._4_4_ = idx;
  plStack_10 = L;
  lua_len(L,idx);
  lStack_20 = lua_tointegerx(plStack_10,-1,&local_24);
  if (local_24 == 0) {
    luaL_error(plStack_10,"object length is not an integer");
  }
  lua_settop(plStack_10,-2);
  return lStack_20;
}

Assistant:

LUALIB_API lua_Integer luaL_len (lua_State *L, int idx) {
  lua_Integer l;
  int isnum;
  lua_len(L, idx);
  l = lua_tointegerx(L, -1, &isnum);
  if (!isnum)
    luaL_error(L, "object length is not an integer");
  lua_pop(L, 1);  /* remove object */
  return l;
}